

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O0

string * fs_generate_random_alphanumeric_string_abi_cxx11_
                   (string *__return_storage_ptr__,size_type len)

{
  anon_class_16_2_f6bc3ac2 __gen;
  size_type sVar1;
  iterator __first;
  long *in_FS_OFFSET;
  allocator<char> local_3a;
  undefined1 local_39;
  undefined1 local_38 [8];
  uniform_int_distribution<unsigned_long> dist;
  string_view chars;
  size_type len_local;
  string *result;
  
  dist._M_param._M_b = 0x3e;
  if (*(char *)(*in_FS_OFFSET + -8) == '\0') {
    fs_random_generator<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
              ();
    *(undefined1 *)(*in_FS_OFFSET + -8) = 1;
  }
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::length
                    ((basic_string_view<char,_std::char_traits<char>_> *)&dist._M_param._M_b);
  std::uniform_int_distribution<unsigned_long>::uniform_int_distribution
            ((uniform_int_distribution<unsigned_long> *)local_38,0,sVar1 - 1);
  local_39 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,len,'\0',&local_3a);
  std::allocator<char>::~allocator(&local_3a);
  __first = std::begin<std::__cxx11::string>(__return_storage_ptr__);
  __gen.chars = (string_view *)&dist._M_param._M_b;
  __gen.dist = (uniform_int_distribution<unsigned_long> *)local_38;
  std::
  generate_n<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,fs_generate_random_alphanumeric_string(unsigned_long)::__0>
            ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )__first._M_current,len,__gen);
  return __return_storage_ptr__;
}

Assistant:

std::string fs_generate_random_alphanumeric_string(const std::string::size_type len)
{
#ifdef __cpp_deduction_guides
  constexpr std::string_view chars =
      "0123456789"
      "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
      "abcdefghijklmnopqrstuvwxyz";
  thread_local auto rng = fs_random_generator<>();
  auto dist = std::uniform_int_distribution<std::string::size_type>(0, chars.length() - 1);
  auto result = std::string(len, '\0');
  std::generate_n(std::begin(result), len, [&]() { return chars[dist(rng)]; });
  return result;
#else
  fs_print_error("" , __func__, std::make_error_code(std::errc::function_not_supported));
  return {};
#endif
}